

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O1

int lcall_address(em8051 *aCPU)

{
  ulong uVar1;
  
  push_to_stack(aCPU,aCPU->mPC + 3U & 0xff);
  push_to_stack(aCPU,aCPU->mPC + 3 >> 8);
  uVar1 = (long)aCPU->mCodeMemSize - 1;
  aCPU->mPC = (uint)CONCAT11(aCPU->mCodeMem[(long)aCPU->mPC + 1U & uVar1],
                             aCPU->mCodeMem[(long)(int)uVar1 & (long)aCPU->mPC + 2U]);
  return 1;
}

Assistant:

static int lcall_address(struct em8051 *aCPU)
{
    push_to_stack(aCPU, (PC + 3) & 0xff);
    push_to_stack(aCPU, (PC + 3) >> 8);
    PC = (aCPU->mCodeMem[(PC + 1) & (aCPU->mCodeMemSize-1)] << 8) | 
         (aCPU->mCodeMem[(PC + 2) & (aCPU->mCodeMemSize-1)] << 0);
    return 1;
}